

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QStyleSheetStyle * __thiscall
QStyleSheetStyle::standardPixmap
          (QStyleSheetStyle *this,StandardPixmap standardPixmap,QStyleOption *opt,QWidget *w)

{
  QStyleSheetStyle *pQVar1;
  char cVar2;
  bool bVar3;
  QStyle *pQVar4;
  QMetaType QVar5;
  undefined4 in_register_00000034;
  QStyleSheetStyle *this_00;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  QObject *in_R8;
  long in_FS_OFFSET;
  double dVar7;
  QLatin1StringView QVar8;
  QIcon icon;
  QIcon local_f8;
  QLatin1StringView local_f0;
  QRenderRule local_e0;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  pQVar1 = globalStyleSheetStyle;
  this_00 = (QStyleSheetStyle *)CONCAT44(in_register_00000034,standardPixmap);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != this_00 && globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar4 = baseStyle((QStyleSheetStyle *)this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*(long *)pQVar4 + 0xf8))(this,pQVar4,(ulong)opt & 0xffffffff,w);
      return this;
    }
    goto LAB_003664f9;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = this_00;
  }
  QVar8 = propertyNameForStandardPixmap((StandardPixmap)opt);
  if (QVar8.m_size == 0) {
LAB_003663c4:
    pQVar4 = baseStyle((QStyleSheetStyle *)this_00);
    (**(code **)(*(long *)pQVar4 + 0xf8))(this,pQVar4,(ulong)opt & 0xffffffff,w,in_R8);
  }
  else {
    paVar6 = &local_58;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    renderRule(&local_e0,(QStyleSheetStyle *)this_00,in_R8,(QStyleOption *)w,0);
    local_f0 = QVar8;
    QHash<QString,_QVariant>::value<QLatin1String,_true>
              ((QVariant *)paVar6,(QHash<QString,_QVariant> *)&local_e0.styleHints,&local_f0);
    QRenderRule::~QRenderRule(&local_e0);
    if ((puStack_40 < (undefined1 *)0x4) ||
       (cVar2 = QMetaType::canConvert
                          ((QMetaTypeInterface *)((ulong)puStack_40 & 0xfffffffffffffffc),
                           (QMetaType)0x7e7fd0), cVar2 == '\0')) {
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_003663c4;
    }
    local_f8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_e0._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    local_f0.m_size = (ulong)puStack_40 & 0xfffffffffffffffc;
    bVar3 = comparesEqual((QMetaType *)&local_f0,(QMetaType *)&local_e0);
    if (bVar3) {
      if (((ulong)puStack_40 & 1) == 0) {
        paVar6 = &local_58;
      }
      else {
        paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QIcon::QIcon(&local_f8,(QIcon *)&paVar6->shared);
    }
    else {
      local_f8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon(&local_f8);
      QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_40 & 1) != 0) {
        paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar5,paVar6,(QMetaType)local_e0._0_8_,&local_f8);
    }
    local_e0._0_8_ = (QMetaTypeInterface *)0x1000000010;
    if (in_R8 == (QObject *)0x0) {
      dVar7 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar7 = (double)QPaintDevice::devicePixelRatio();
    }
    QIcon::pixmap((QSize *)this,dVar7,(Mode)&local_f8,(State)(QMetaType *)&local_e0);
    QIcon::~QIcon(&local_f8);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (pQVar1 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_003664f9:
  __stack_chk_fail();
}

Assistant:

QPixmap QStyleSheetStyle::standardPixmap(StandardPixmap standardPixmap, const QStyleOption *opt,
                                         const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->standardPixmap(standardPixmap, opt, w))
    const auto s = propertyNameForStandardPixmap(standardPixmap);
    if (!s.isEmpty()) {
        const auto styleHint = renderRule(w, opt).styleHint(s);
        if (styleHint.isValid() && styleHint.canConvert<QIcon>()) {
            QIcon icon = qvariant_cast<QIcon>(styleHint);
            return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(w));
        }
    }
    return baseStyle()->standardPixmap(standardPixmap, opt, w);
}